

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
* embree::SceneGraph::transformMSMBlurVectorVec3faBuffer<embree::Vec3fa>
            (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             *vectors_in,Transformations *spaces)

{
  size_type sVar1;
  long in_RDX;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_RSI;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_RDI;
  size_t i_5;
  avector<embree::Vec3fa> vecs_1;
  AffineSpace3ff space;
  float time;
  size_t t;
  size_t j;
  avector<embree::Vec3fa> vecs;
  size_t i;
  size_t num_vertices;
  size_t num_time_steps;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *vectors_out;
  size_t i_4;
  size_t i_1;
  size_t i_6;
  size_t i_7;
  size_t i_2;
  size_t i_3;
  value_type *in_stack_fffffffffffff3f8;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_fffffffffffff400;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *pvVar2;
  size_t in_stack_fffffffffffff408;
  void *in_stack_fffffffffffff430;
  Transformations *in_stack_fffffffffffff438;
  Transformations *pTVar3;
  float local_bc0;
  undefined4 in_stack_fffffffffffff448;
  undefined4 in_stack_fffffffffffff44c;
  undefined4 in_stack_fffffffffffff450;
  undefined4 in_stack_fffffffffffff454;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_b38 [2];
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined1 local_b08 [16];
  undefined8 local_af8;
  undefined8 uStack_af0;
  ulong local_ae0;
  undefined1 local_ad8 [8];
  pointer local_ad0;
  pointer local_ac8;
  size_t local_ac0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *local_ab8 [2];
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined1 local_a88 [20];
  float local_a74;
  ulong local_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  ulong local_a10;
  undefined1 local_a08 [8];
  ulong local_a00;
  ulong local_9f8;
  void *local_9f0;
  ulong local_9e8;
  size_t local_9d0;
  size_type local_9c8;
  undefined1 local_9b9;
  long local_9b8;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *local_9b0;
  long local_9a0;
  const_reference local_998;
  undefined1 *local_990;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *local_980;
  size_t local_970;
  undefined1 *local_968;
  size_t local_960;
  Transformations *local_958;
  ulong local_950;
  undefined1 *local_948;
  ulong local_940;
  undefined1 *local_938;
  ulong local_930;
  const_reference local_928;
  ulong local_920;
  const_reference local_918;
  undefined8 *local_910;
  undefined8 *local_908;
  undefined8 *local_900;
  undefined8 *local_8f8;
  long local_8f0;
  ulong local_8e8;
  long local_8e0;
  ulong local_8d8;
  long local_8d0;
  undefined8 *local_8c8;
  undefined8 *local_8c0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_8b8;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_8b0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_8a8;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_8a0;
  undefined8 *local_898;
  undefined8 *local_890;
  undefined8 *local_888;
  undefined8 *local_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 *local_860;
  undefined8 *local_858;
  undefined8 *local_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 *local_830;
  undefined8 *local_828;
  undefined8 *local_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 *local_800;
  undefined8 *local_7f8;
  undefined8 *local_7f0;
  undefined8 *local_7d0;
  undefined8 *local_7c8;
  undefined8 *local_7c0;
  undefined8 *local_7a0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_798;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_790;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_770;
  undefined1 *local_768;
  undefined1 *local_760;
  undefined1 *local_740;
  undefined8 *local_738;
  undefined8 *local_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 *local_710;
  Vec3fa *local_708;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_700;
  undefined8 *local_6f8;
  Vec3fa *local_6f0;
  undefined8 *local_6e8;
  undefined8 *local_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  Vec3fa *local_688;
  undefined8 *local_680;
  undefined8 *local_678;
  undefined8 *local_670;
  undefined8 *local_668;
  undefined8 *local_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  undefined8 *local_620;
  float local_614;
  undefined8 *local_610;
  float local_608;
  float fStack_604;
  float fStack_600;
  float fStack_5fc;
  float local_5f8;
  float local_5f4;
  undefined8 *local_5f0;
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  float local_5d8;
  float local_5d4;
  undefined8 *local_5d0;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  float local_5b8;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 *local_590;
  undefined8 *local_588;
  undefined8 *local_580;
  undefined8 *local_578;
  undefined8 *local_570;
  undefined8 *local_568;
  undefined8 *local_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined8 *local_528;
  undefined8 *local_520;
  undefined8 *local_518;
  undefined8 *local_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined8 *local_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 *local_4b0;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  undefined8 *local_498;
  undefined8 *local_490;
  undefined8 *local_488;
  undefined8 *local_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 *local_448;
  undefined8 *local_440;
  undefined8 *local_438;
  undefined8 *local_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined8 *local_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  Vec3fa *local_398;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_390;
  undefined8 *local_388;
  undefined8 *local_380;
  undefined8 *local_378;
  undefined8 *local_370;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined8 *local_330;
  float local_324;
  undefined8 *local_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float local_304;
  undefined8 *local_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float local_2e4;
  undefined8 *local_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 *local_2a0;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_298;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined8 *local_238;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> **local_230;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined8 local_218;
  float fStack_210;
  float fStack_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 *local_158;
  undefined8 *local_150;
  undefined8 *local_148;
  undefined8 *local_140;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined8 *local_108;
  ulong local_100;
  size_t local_f8;
  Transformations *local_f0;
  long local_e8;
  size_t local_e0;
  Transformations *local_d8;
  ulong local_d0;
  size_t local_c8;
  undefined1 *local_c0;
  void *local_b8;
  size_t local_b0;
  undefined1 *local_a8;
  pointer local_90;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *local_88;
  ulong local_70;
  undefined1 *local_68;
  ulong local_60;
  void *local_58;
  undefined1 *local_50;
  pointer local_30;
  size_t local_28;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *local_20;
  
  local_9b8 = in_RDX;
  local_9b0 = in_RSI;
  sVar1 = std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::size(in_RSI);
  if (sVar1 == 0) {
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::vector((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff454,in_stack_fffffffffffff450),
             (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff44c,in_stack_fffffffffffff448));
  }
  else {
    local_9b9 = 0;
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::vector((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              *)0x2a0ae4);
    local_9c8 = std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::size(local_9b0);
    local_998 = std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::operator[](local_9b0,0);
    local_9d0 = local_998->size_active;
    if (local_9c8 == 1) {
      local_9e8 = 0;
      while( true ) {
        local_9a0 = local_9b8;
        local_8f0 = local_9b8 + 8;
        if (*(ulong *)(local_9b8 + 0x10) <= local_9e8) break;
        local_968 = local_a08;
        local_970 = local_9d0;
        local_a00 = 0;
        local_9f8 = 0;
        local_9f0 = (void *)0x0;
        local_c8 = local_9d0;
        local_c0 = local_968;
        if (local_9d0 != 0) {
          local_b0 = local_9d0;
          local_a8 = local_968;
          local_9f0 = alignedMalloc(in_stack_fffffffffffff408,(size_t)in_stack_fffffffffffff400);
          for (local_d0 = 0; local_d0 < local_c8; local_d0 = local_d0 + 1) {
            local_b8 = (void *)((long)local_9f0 + local_d0 * 0x10);
          }
          local_9f8 = local_c8;
        }
        local_a00 = local_9f8;
        for (local_a10 = 0; local_a10 < local_9d0; local_a10 = local_a10 + 1) {
          local_8e0 = local_9b8;
          local_8e8 = local_9e8;
          local_8d0 = local_9b8 + 8;
          local_8d8 = local_9e8;
          local_8c8 = (undefined8 *)(*(long *)(local_9b8 + 0x20) + local_9e8 * 0x40);
          local_8c0 = &local_a68;
          local_818 = *local_8c8;
          uStack_810 = local_8c8[1];
          local_850 = &local_a58;
          local_858 = local_8c8 + 2;
          local_848 = *local_858;
          uStack_840 = local_8c8[3];
          local_880 = &local_a48;
          local_888 = local_8c8 + 4;
          local_878 = *local_888;
          uStack_870 = local_8c8[5];
          local_730 = &local_a38;
          local_738 = local_8c8 + 6;
          local_728 = *local_738;
          uStack_720 = local_8c8[7];
          local_898 = local_8c8;
          local_890 = local_8c0;
          local_860 = local_880;
          local_830 = local_850;
          local_828 = local_8c8;
          local_820 = local_8c0;
          local_800 = local_8c0;
          local_710 = local_730;
          local_a68 = local_818;
          uStack_a60 = uStack_810;
          local_a58 = local_848;
          uStack_a50 = uStack_840;
          local_a48 = local_878;
          uStack_a40 = uStack_870;
          local_a38 = local_728;
          uStack_a30 = uStack_720;
          local_918 = std::
                      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      ::operator[](local_9b0,0);
          local_920 = local_a10;
          local_6f0 = local_918->items + local_a10;
          local_6e0 = &local_a28;
          local_6e8 = &local_a68;
          local_614 = (local_6f0->field_0).m128[0];
          local_610 = &local_698;
          local_4f8 = CONCAT44(local_614,local_614);
          uStack_4f0 = CONCAT44(local_614,local_614);
          local_5f4 = (local_6f0->field_0).m128[1];
          local_5f0 = &local_6b8;
          local_418 = CONCAT44(local_5f4,local_5f4);
          uStack_410 = CONCAT44(local_5f4,local_5f4);
          local_4a8 = &local_a58;
          local_5d4 = (local_6f0->field_0).m128[2];
          local_5d0 = &local_6d8;
          local_648 = CONCAT44(local_5d4,local_5d4);
          uStack_640 = CONCAT44(local_5d4,local_5d4);
          local_670 = &local_a48;
          local_660 = &local_6c8;
          local_668 = &local_6d8;
          local_658._0_4_ = (float)local_a48;
          local_658._4_4_ = (float)((ulong)local_a48 >> 0x20);
          uStack_650._0_4_ = (float)uStack_a40;
          uStack_650._4_4_ = (float)((ulong)uStack_a40 >> 0x20);
          local_638 = local_5d4 * (float)local_658;
          fStack_634 = local_5d4 * local_658._4_4_;
          fStack_630 = local_5d4 * (float)uStack_650;
          fStack_62c = local_5d4 * uStack_650._4_4_;
          local_620 = &local_6c8;
          local_498 = &local_6a8;
          local_4a0 = &local_6b8;
          local_4b0 = &local_6c8;
          local_430 = &local_4c8;
          local_428._0_4_ = (float)local_a58;
          local_428._4_4_ = (float)((ulong)local_a58 >> 0x20);
          uStack_420._0_4_ = (float)uStack_a50;
          uStack_420._4_4_ = (float)((ulong)uStack_a50 >> 0x20);
          local_408 = local_5f4 * (float)local_428;
          fStack_404 = local_5f4 * local_428._4_4_;
          fStack_400 = local_5f4 * (float)uStack_420;
          fStack_3fc = local_5f4 * uStack_420._4_4_;
          local_3f0 = &local_4c8;
          local_468 = CONCAT44(fStack_404,local_408);
          uStack_460 = CONCAT44(fStack_3fc,fStack_400);
          local_480 = &local_6a8;
          local_488 = &local_4c8;
          local_478._0_4_ = (float)local_6c8;
          local_478._4_4_ = (float)((ulong)local_6c8 >> 0x20);
          uStack_470._0_4_ = (float)uStack_6c0;
          uStack_470._4_4_ = (float)((ulong)uStack_6c0 >> 0x20);
          local_458 = local_408 + (float)local_478;
          fStack_454 = fStack_404 + local_478._4_4_;
          fStack_450 = fStack_400 + (float)uStack_470;
          fStack_44c = fStack_3fc + uStack_470._4_4_;
          local_448 = &local_6a8;
          local_578 = &local_a28;
          local_580 = &local_698;
          local_590 = &local_6a8;
          local_510 = &local_5a8;
          local_508._0_4_ = (float)local_a68;
          local_508._4_4_ = (float)((ulong)local_a68 >> 0x20);
          uStack_500._0_4_ = (float)uStack_a60;
          uStack_500._4_4_ = (float)((ulong)uStack_a60 >> 0x20);
          local_4e8 = local_614 * (float)local_508;
          fStack_4e4 = local_614 * local_508._4_4_;
          fStack_4e0 = local_614 * (float)uStack_500;
          fStack_4dc = local_614 * uStack_500._4_4_;
          local_4d0 = &local_5a8;
          local_548 = CONCAT44(fStack_4e4,local_4e8);
          uStack_540 = CONCAT44(fStack_4dc,fStack_4e0);
          local_560 = &local_a28;
          local_568 = &local_5a8;
          local_558._0_4_ = (float)local_6a8;
          local_558._4_4_ = (float)((ulong)local_6a8 >> 0x20);
          uStack_550._0_4_ = (float)uStack_6a0;
          uStack_550._4_4_ = (float)((ulong)uStack_6a0 >> 0x20);
          local_538 = local_4e8 + (float)local_558;
          fStack_534 = fStack_4e4 + local_558._4_4_;
          fStack_530 = fStack_4e0 + (float)uStack_550;
          fStack_52c = fStack_4dc + uStack_550._4_4_;
          local_528 = &local_a28;
          local_a28 = CONCAT44(fStack_534,local_538);
          uStack_a20 = CONCAT44(fStack_52c,fStack_530);
          local_940 = local_a10;
          local_938 = local_a08;
          local_8f8 = (undefined8 *)((long)local_9f0 + local_a10 * 0x10);
          local_900 = &local_a28;
          *local_8f8 = local_a28;
          local_8f8[1] = uStack_a20;
          local_688 = local_6f0;
          local_680 = local_6e8;
          local_678 = local_6e0;
          local_658 = local_a48;
          uStack_650 = uStack_a40;
          local_608 = local_614;
          fStack_604 = local_614;
          fStack_600 = local_614;
          fStack_5fc = local_614;
          local_5f8 = local_614;
          local_5e8 = local_5f4;
          fStack_5e4 = local_5f4;
          fStack_5e0 = local_5f4;
          fStack_5dc = local_5f4;
          local_5d8 = local_5f4;
          local_5c8 = local_5d4;
          fStack_5c4 = local_5d4;
          fStack_5c0 = local_5d4;
          fStack_5bc = local_5d4;
          local_5b8 = local_5d4;
          local_588 = local_6e8;
          local_570 = local_590;
          local_558 = local_6a8;
          uStack_550 = uStack_6a0;
          local_520 = local_6e8;
          local_518 = local_580;
          local_508 = local_a68;
          uStack_500 = uStack_a60;
          local_490 = local_4b0;
          local_478 = local_6c8;
          uStack_470 = uStack_6c0;
          local_440 = local_4a8;
          local_438 = local_4a0;
          local_428 = local_a58;
          uStack_420 = uStack_a50;
          local_6d8 = local_648;
          uStack_6d0 = uStack_640;
          local_6c8 = CONCAT44(fStack_634,local_638);
          uStack_6c0 = CONCAT44(fStack_62c,fStack_630);
          local_6b8 = local_418;
          uStack_6b0 = uStack_410;
          local_6a8 = CONCAT44(fStack_454,local_458);
          uStack_6a0 = CONCAT44(fStack_44c,fStack_450);
          local_698 = local_4f8;
          uStack_690 = uStack_4f0;
          local_5a8 = local_548;
          uStack_5a0 = uStack_540;
          local_4c8 = local_468;
          uStack_4c0 = uStack_460;
        }
        std::
        vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        ::push_back(in_stack_fffffffffffff400,in_stack_fffffffffffff3f8);
        local_990 = local_a08;
        for (local_70 = 0; local_70 < local_a00; local_70 = local_70 + 1) {
        }
        local_60 = local_9f8;
        local_58 = local_9f0;
        local_68 = local_990;
        local_50 = local_990;
        alignedFree(in_stack_fffffffffffff3f8);
        local_9e8 = local_9e8 + 1;
      }
    }
    else {
      for (local_a70 = 0; local_a70 < local_9c8; local_a70 = local_a70 + 1) {
        if (local_9c8 < 2) {
          local_bc0 = 0.0;
        }
        else {
          local_bc0 = (float)local_a70 / (float)(local_9c8 - 1);
        }
        local_a74 = local_bc0;
        Transformations::interpolate
                  (in_stack_fffffffffffff438,(float)((ulong)in_stack_fffffffffffff430 >> 0x20));
        in_stack_fffffffffffff438 = (Transformations *)local_ad8;
        local_960 = local_9d0;
        local_ad0 = (pointer)0x0;
        local_ac8 = (pointer)0x0;
        local_ac0 = 0;
        local_f8 = local_9d0;
        local_958 = in_stack_fffffffffffff438;
        local_f0 = in_stack_fffffffffffff438;
        if (local_9d0 != 0) {
          local_e0 = local_9d0;
          local_d8 = in_stack_fffffffffffff438;
          in_stack_fffffffffffff430 =
               alignedMalloc(in_stack_fffffffffffff408,(size_t)in_stack_fffffffffffff400);
          (in_stack_fffffffffffff438->spaces).size_alloced = (size_t)in_stack_fffffffffffff430;
          for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
            local_e8 = (in_stack_fffffffffffff438->spaces).size_alloced + local_100 * 0x10;
          }
          pTVar3 = in_stack_fffffffffffff438;
          *(size_t *)&in_stack_fffffffffffff438->spaces = local_f8;
          (in_stack_fffffffffffff438->spaces).size_active = local_f8;
          in_stack_fffffffffffff438 = pTVar3;
        }
        for (local_ae0 = 0; local_ae0 < local_9d0; local_ae0 = local_ae0 + 1) {
          local_8b0 = local_b38;
          local_8b8 = local_ab8;
          local_b38[0] = local_ab8[0];
          local_b38[1] = local_ab8[1];
          local_7c0 = &local_b28;
          local_7c8 = &local_aa8;
          local_b28 = local_aa8;
          uStack_b20 = uStack_aa0;
          local_7f0 = &local_b18;
          local_7f8 = &local_a98;
          local_b18 = local_a98;
          uStack_b10 = uStack_a90;
          local_760 = local_b08;
          local_768 = local_a88;
          local_8a8 = local_8b8;
          local_8a0 = local_8b0;
          local_7d0 = local_7f0;
          local_7a0 = local_7c0;
          local_798 = local_8b8;
          local_790 = local_8b0;
          local_770 = local_8b0;
          local_740 = local_760;
          local_928 = std::
                      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      ::operator[](local_9b0,local_a70);
          local_930 = local_ae0;
          local_708 = local_928->items + local_ae0;
          local_6f8 = &local_af8;
          local_700 = local_b38;
          local_324 = (local_708->field_0).m128[0];
          local_320 = &local_3a8;
          local_208 = CONCAT44(local_324,local_324);
          uStack_200 = CONCAT44(local_324,local_324);
          local_304 = (local_708->field_0).m128[1];
          local_300 = &local_3c8;
          local_128 = CONCAT44(local_304,local_304);
          uStack_120 = CONCAT44(local_304,local_304);
          local_1b8 = &local_b28;
          local_2e4 = (local_708->field_0).m128[2];
          local_2e0 = &local_3e8;
          local_358 = CONCAT44(local_2e4,local_2e4);
          uStack_350 = CONCAT44(local_2e4,local_2e4);
          local_380 = &local_b18;
          local_370 = &local_3d8;
          local_378 = &local_3e8;
          local_368 = (float)local_b18;
          fStack_364 = (float)((ulong)local_b18 >> 0x20);
          fStack_360 = (float)uStack_b10;
          fStack_35c = (float)((ulong)uStack_b10 >> 0x20);
          local_348 = local_2e4 * local_368;
          fStack_344 = local_2e4 * fStack_364;
          fStack_340 = local_2e4 * fStack_360;
          fStack_33c = local_2e4 * fStack_35c;
          local_330 = &local_3d8;
          local_1a8 = &local_3b8;
          local_1b0 = &local_3c8;
          local_1c0 = &local_3d8;
          local_140 = &local_1d8;
          local_138 = (float)local_b28;
          fStack_134 = (float)((ulong)local_b28 >> 0x20);
          fStack_130 = (float)uStack_b20;
          fStack_12c = (float)((ulong)uStack_b20 >> 0x20);
          local_118 = local_304 * local_138;
          fStack_114 = local_304 * fStack_134;
          fStack_110 = local_304 * fStack_130;
          fStack_10c = local_304 * fStack_12c;
          local_108 = &local_1d8;
          local_178 = CONCAT44(fStack_114,local_118);
          uStack_170 = CONCAT44(fStack_10c,fStack_110);
          local_190 = &local_3b8;
          local_198 = &local_1d8;
          local_188._0_4_ = (float)local_3d8;
          local_188._4_4_ = (float)((ulong)local_3d8 >> 0x20);
          uStack_180._0_4_ = (float)uStack_3d0;
          uStack_180._4_4_ = (float)((ulong)uStack_3d0 >> 0x20);
          local_168 = local_118 + (float)local_188;
          fStack_164 = fStack_114 + local_188._4_4_;
          fStack_160 = fStack_110 + (float)uStack_180;
          fStack_15c = fStack_10c + uStack_180._4_4_;
          local_158 = &local_3b8;
          local_288 = &local_af8;
          local_290 = &local_3a8;
          local_2a0 = &local_3b8;
          local_220 = &local_2b8;
          local_218._0_4_ = SUB84(local_b38[0],0);
          local_218._4_4_ = (float)((ulong)local_b38[0] >> 0x20);
          fStack_210 = SUB84(local_b38[1],0);
          fStack_20c = (float)((ulong)local_b38[1] >> 0x20);
          local_1f8 = local_324 * (float)local_218;
          fStack_1f4 = local_324 * local_218._4_4_;
          fStack_1f0 = local_324 * fStack_210;
          fStack_1ec = local_324 * fStack_20c;
          local_1e0 = &local_2b8;
          local_258 = CONCAT44(fStack_1f4,local_1f8);
          uStack_250 = CONCAT44(fStack_1ec,fStack_1f0);
          local_270 = &local_af8;
          local_278 = &local_2b8;
          local_268._0_4_ = (float)local_3b8;
          local_268._4_4_ = (float)((ulong)local_3b8 >> 0x20);
          uStack_260._0_4_ = (float)uStack_3b0;
          uStack_260._4_4_ = (float)((ulong)uStack_3b0 >> 0x20);
          local_248 = local_1f8 + (float)local_268;
          fStack_244 = fStack_1f4 + local_268._4_4_;
          fStack_240 = fStack_1f0 + (float)uStack_260;
          fStack_23c = fStack_1ec + uStack_260._4_4_;
          local_238 = &local_af8;
          local_af8 = CONCAT44(fStack_244,local_248);
          uStack_af0 = CONCAT44(fStack_23c,fStack_240);
          local_950 = local_ae0;
          local_948 = local_ad8;
          local_908 = (undefined8 *)(local_ac0 + local_ae0 * 0x10);
          local_910 = &local_af8;
          *local_908 = local_af8;
          local_908[1] = uStack_af0;
          local_398 = local_708;
          local_390 = local_700;
          local_388 = local_6f8;
          local_318 = local_324;
          fStack_314 = local_324;
          fStack_310 = local_324;
          fStack_30c = local_324;
          local_308 = local_324;
          local_2f8 = local_304;
          fStack_2f4 = local_304;
          fStack_2f0 = local_304;
          fStack_2ec = local_304;
          local_2e8 = local_304;
          local_2d8 = local_2e4;
          fStack_2d4 = local_2e4;
          fStack_2d0 = local_2e4;
          fStack_2cc = local_2e4;
          local_2c8 = local_2e4;
          local_298 = local_700;
          local_280 = local_2a0;
          local_268 = local_3b8;
          uStack_260 = uStack_3b0;
          local_230 = local_700;
          local_228 = local_290;
          local_218 = local_b38[0];
          _fStack_210 = local_b38[1];
          local_1a0 = local_1c0;
          local_188 = local_3d8;
          uStack_180 = uStack_3d0;
          local_150 = local_1b8;
          local_148 = local_1b0;
          local_3e8 = local_358;
          uStack_3e0 = uStack_350;
          local_3d8 = CONCAT44(fStack_344,local_348);
          uStack_3d0 = CONCAT44(fStack_33c,fStack_340);
          local_3c8 = local_128;
          uStack_3c0 = uStack_120;
          local_3b8 = CONCAT44(fStack_164,local_168);
          uStack_3b0 = CONCAT44(fStack_15c,fStack_160);
          local_3a8 = local_208;
          uStack_3a0 = uStack_200;
          local_2b8 = local_258;
          uStack_2b0 = uStack_250;
          local_1d8 = local_178;
          uStack_1d0 = uStack_170;
        }
        std::
        vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        ::push_back(in_stack_fffffffffffff400,in_stack_fffffffffffff3f8);
        pvVar2 = (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  *)local_ad8;
        for (local_90 = (pointer)0x0; local_90 < local_ad0; local_90 = (pointer)&local_90->field_0x1
            ) {
        }
        local_30 = local_ac8;
        local_28 = local_ac0;
        local_980 = pvVar2;
        local_88 = pvVar2;
        local_20 = pvVar2;
        alignedFree(in_stack_fffffffffffff3f8);
        in_stack_fffffffffffff400 = pvVar2;
        pvVar2[1].
        super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar2->
        super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pvVar2->
        super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      }
    }
  }
  return in_RDI;
}

Assistant:

std::vector<avector<Vertex>> transformMSMBlurVectorVec3faBuffer(const std::vector<avector<Vertex>>& vectors_in, const Transformations& spaces)
    {
      if (vectors_in.size() == 0)
        return vectors_in;
      
      std::vector<avector<Vertex>> vectors_out;
      const size_t num_time_steps = vectors_in.size();
      const size_t num_vertices = vectors_in[0].size();

      /* if we have only one set of vertices, use transformation to generate more vertex sets */
      if (num_time_steps == 1)
      {
        for (size_t i=0; i<spaces.size(); i++) 
        {
          avector<Vertex> vecs(num_vertices);
          for (size_t j=0; j<num_vertices; j++) {
            vecs[j] = xfmVector((AffineSpace3fa)spaces[i],vectors_in[0][j]);
          }
          vectors_out.push_back(std::move(vecs));
        }
      } 
      /* otherwise transform all vertex sets with interpolated transformation */
      else
      {
        for (size_t t=0; t<num_time_steps; t++) 
        {
          float time = num_time_steps > 1 ? float(t)/float(num_time_steps-1) : 0.0f;
          const AffineSpace3ff space = spaces.interpolate(time);
          avector<Vertex> vecs(num_vertices);
          for (size_t i=0; i<num_vertices; i++) {
            vecs[i] = xfmVector ((AffineSpace3fa)space,vectors_in[t][i]);
          }
          vectors_out.push_back(std::move(vecs));
        }
      }
      return vectors_out;
    }